

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommytrie.c
# Opt level: O2

void tommy_trie_insert(tommy_trie *trie,tommy_trie_node *node,void *data,tommy_key_t key)

{
  long lVar1;
  tommy_node_struct *ptVar2;
  byte bVar3;
  void *pvVar4;
  long lVar5;
  uint uVar6;
  uint uVar7;
  tommy_node_struct *ptVar8;
  byte bVar9;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  node->data = data;
  node->key = key;
  bVar9 = 0x1b;
  ptVar8 = (tommy_node_struct *)(trie->bucket + (key >> 0x1b));
  while (ptVar2 = ptVar8->next, ptVar2 != (tommy_node_struct *)0x0) {
    if (((ulong)ptVar2 & 1) == 0) {
      if (ptVar2->key != key) goto LAB_0010f0d7;
      node->prev = ptVar2->prev;
      ptVar2->prev = node;
      node->next = (tommy_node_struct *)0x0;
      ptVar8 = node->prev;
      goto LAB_0010f137;
    }
    bVar3 = bVar9 & 0x1f;
    bVar9 = bVar9 - 3;
    ptVar8 = (tommy_node_struct *)((long)ptVar2 + (ulong)(key >> bVar3 & 7) * 8 + -1);
  }
LAB_0010f12f:
  node->prev = node;
  node->next = (tommy_node_struct *)0x0;
LAB_0010f137:
  ptVar8->next = node;
  trie->count = trie->count + 1;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
LAB_0010f0d7:
  while( true ) {
    pvVar4 = tommy_allocator_alloc(trie->alloc);
    trie->node_count = trie->node_count + 1;
    ptVar8->next = (tommy_node_struct *)((long)pvVar4 + 1);
    for (lVar5 = 0; lVar5 != 8; lVar5 = lVar5 + 1) {
      *(undefined8 *)((long)pvVar4 + lVar5 * 8) = 0;
    }
    uVar7 = ptVar2->key >> (bVar9 & 0x1f) & 7;
    uVar6 = key >> (bVar9 & 0x1f) & 7;
    ptVar8 = (tommy_node_struct *)((long)pvVar4 + (ulong)uVar7 * 8);
    if (uVar7 != uVar6) break;
    bVar9 = bVar9 - 3;
  }
  ptVar8->next = ptVar2;
  ptVar8 = (tommy_node_struct *)((long)pvVar4 + (ulong)uVar6 * 8);
  goto LAB_0010f12f;
}

Assistant:

void tommy_trie_insert(tommy_trie* trie, tommy_trie_node* node, void* data, tommy_key_t key)
{
	tommy_trie_node** let_ptr;

	node->data = data;
	node->key = key;

	let_ptr = &trie->bucket[key >> TOMMY_TRIE_BUCKET_SHIFT];

	trie_bucket_insert(trie, TOMMY_TRIE_BUCKET_SHIFT, let_ptr, node, key);

	++trie->count;
}